

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

bool __thiscall
pbrt::Curve::RecursiveIntersect
          (Curve *this,Ray *ray,Float tMax,span<const_pbrt::Point3<float>_> cp,
          Transform *ObjectFromRay,Float u0,Float u1,int depth,optional<pbrt::ShapeIntersection> *si
          )

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [60];
  undefined1 auVar4 [60];
  span<const_pbrt::Point3<float>_> cp_00;
  bool bVar5;
  float *pfVar6;
  Point3<float> *pPVar7;
  ShapeIntersection *pSVar8;
  Point3<float> *in_RDX;
  Curve *in_RSI;
  Point3<float> *in_RDI;
  undefined8 in_R8;
  Float in_R9D;
  long *in_FS_OFFSET;
  float in_XMM0_Da;
  type u1_00;
  type tVar9;
  Float val;
  type tVar10;
  double dVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar29 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float in_XMM1_Da;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [56];
  float in_XMM2_Da;
  Normal3<float> NVar33;
  Point3<float> PVar34;
  Vector3<float> VVar35;
  Point3f PVar36;
  optional<pbrt::ShapeIntersection> *unaff_retaddr;
  optional<pbrt::ShapeIntersection> *in_stack_00000008;
  SurfaceInteraction intr;
  Point3fi pi;
  bool flipNormal;
  Vector3f pError;
  Transform rot;
  Float theta;
  Vector3f dpdvPlane;
  Vector3f dpduPlane;
  Vector3f vb;
  Vector3f va;
  Vector3f dpdv;
  Vector3f dpdu;
  Float v;
  Float edgeFunc;
  Float ptCurveDist;
  Float tHit;
  Float ptCurveDist2;
  Point3f pc;
  Vector3f dpcdw;
  Float sin1;
  Float sin0;
  Normal3f nHit;
  Float hitWidth;
  Float u_1;
  Float w;
  Float denom;
  Vector2f segmentDir;
  Float edge;
  bool hit;
  Bounds3f rayBounds;
  Bounds3f curveBounds;
  span<const_pbrt::Point3<float>_> cps;
  Float maxWidth;
  int seg;
  Float u [3];
  array<pbrt::Point3<float>,_7> cpSplit;
  Float rayLength;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffff728;
  optional<pbrt::ShapeIntersection> *in_stack_fffffffffffff730;
  optional<pbrt::ShapeIntersection> *this_00;
  Normal3<float> *in_stack_fffffffffffff738;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffff740;
  Tuple3<pbrt::Normal3,_float> *in_stack_fffffffffffff748;
  Point3f *p;
  Point3fi *in_stack_fffffffffffff750;
  Point3<float> *in_stack_fffffffffffff758;
  Bounds3<float> *in_stack_fffffffffffff760;
  float local_898;
  float in_stack_fffffffffffff76c;
  Ray *this_01;
  Bounds3<float> *in_stack_fffffffffffff778;
  span<const_pbrt::Point3<float>_> *this_02;
  Bounds3<float> *in_stack_fffffffffffff780;
  char (*args) [18];
  undefined4 in_stack_fffffffffffff788;
  float fVar37;
  Vector3f *dpdu_00;
  Vector3f *wo;
  undefined4 in_stack_fffffffffffff7a0;
  float fVar38;
  undefined8 in_stack_fffffffffffff7a8;
  span<const_pbrt::Point3<float>_> *this_03;
  Bounds3<float> *in_stack_fffffffffffff7b0;
  SurfaceInteraction *this_04;
  undefined4 in_stack_fffffffffffff7b8;
  float fVar39;
  Normal3f *dndu;
  Normal3f *dndv;
  bool local_801;
  Vector3<float> *in_stack_fffffffffffff838;
  Transform *in_stack_fffffffffffff840;
  Vector3<float> *in_stack_fffffffffffff8b8;
  Float in_stack_fffffffffffff8c4;
  span<const_pbrt::Point3<float>_> in_stack_fffffffffffff8c8;
  SurfaceInteraction *in_stack_fffffffffffff990;
  Transform *in_stack_fffffffffffff998;
  span<const_pbrt::Point3<float>_> in_stack_fffffffffffff9f8;
  undefined1 local_5f0 [312];
  undefined8 local_4b8;
  float local_4b0;
  undefined8 local_4a8;
  float local_4a0;
  byte local_47d;
  Point3f local_47c;
  undefined8 local_470;
  float local_468;
  undefined8 local_45c;
  float local_454;
  undefined8 local_450;
  float local_448;
  undefined8 local_440;
  float local_438;
  Point3fi local_434 [5];
  Float local_3b4;
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_3a0;
  float local_398;
  undefined8 local_380;
  float local_378;
  undefined8 local_374;
  float local_36c;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  float local_350;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2fc;
  float local_2f4;
  Tuple3<pbrt::Vector3,_float> local_2f0;
  Tuple3<pbrt::Vector3,_float> local_2e4;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c4;
  float local_2bc;
  span<const_pbrt::Point3<float>_> local_2b8;
  undefined8 local_2a4;
  float local_29c;
  Tuple3<pbrt::Vector3,_float> local_298;
  float local_28c;
  float local_288;
  float local_284;
  float local_280;
  float local_27c;
  undefined8 local_278;
  float local_270;
  undefined8 local_250;
  float local_248;
  undefined1 local_244 [52];
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  Tuple3<pbrt::Vector3,_float> local_1ec;
  float local_1e0;
  float local_1dc;
  Tuple3<pbrt::Vector3,_float> local_1d8;
  float local_1cc;
  float local_1c8;
  undefined1 local_1c4 [16];
  float local_1b4;
  type local_1b0;
  undefined1 local_1ac [16];
  undefined8 local_19c;
  float local_194;
  Point3<float> *local_190;
  size_t local_188;
  undefined1 local_179;
  Bounds3<float> local_160;
  Tuple3<pbrt::Point3,_float> local_148 [6];
  Bounds3<float> local_100;
  span<const_pbrt::Point3<float>_> local_e8;
  Float local_d4;
  Float local_d0;
  float local_cc;
  int local_c8;
  float local_c4 [28];
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffc8;
  bool local_9;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  pPVar7 = in_RDI;
  u1_00 = Length<float>((Vector3<float> *)0x79106c);
  if ((int)in_R9D < 1) {
    pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                       ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,1);
    fVar38 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).y;
    pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                       ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,0);
    fVar39 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).y;
    pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                       ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,0);
    fVar37 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).y;
    pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                       ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,0);
    fVar1 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).x;
    pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                       ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,0);
    fVar2 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).x;
    pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                       ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,1);
    auVar30 = vfmadd213ss_fma(ZEXT416((uint)-fVar37),ZEXT416((uint)(fVar38 - fVar39)),
                              ZEXT416((uint)(fVar1 * (fVar2 - (pPVar7->
                                                  super_Tuple3<pbrt::Point3,_float>).x))));
    local_194 = auVar30._0_4_;
    if (0.0 <= local_194) {
      pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                         ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,2);
      fVar38 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).y;
      pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                         ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,3);
      fVar39 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).y;
      pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                         ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,3);
      fVar37 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).y;
      pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                         ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,3);
      fVar1 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).x;
      pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                         ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,3);
      fVar2 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).x;
      pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[]
                         ((span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0,2);
      auVar30 = vfmadd213ss_fma(ZEXT416((uint)-fVar37),ZEXT416((uint)(fVar38 - fVar39)),
                                ZEXT416((uint)(fVar1 * (fVar2 - (pPVar7->
                                                  super_Tuple3<pbrt::Point3,_float>).x))));
      local_194 = auVar30._0_4_;
      if (0.0 <= local_194) {
        this_03 = (span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0;
        wo = (Vector3f *)0x3;
        pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[](this_03,3);
        fVar38 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).x;
        pstd::span<const_pbrt::Point3<float>_>::operator[](this_03,(size_t)wo);
        dndu = (Normal3f *)(local_1ac + 8);
        Point2<float>::Point2
                  ((Point2<float> *)in_stack_fffffffffffff730,
                   (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                   SUB84(in_stack_fffffffffffff728,0));
        this_04 = (SurfaceInteraction *)0x0;
        pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[](this_03,0);
        fVar39 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).x;
        pstd::span<const_pbrt::Point3<float>_>::operator[](this_03,(size_t)this_04);
        dndv = (Normal3f *)local_1ac;
        Point2<float>::Point2
                  ((Point2<float> *)in_stack_fffffffffffff730,
                   (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                   SUB84(in_stack_fffffffffffff728,0));
        auVar12._0_8_ =
             Point2<float>::operator-
                       ((Point2<float> *)in_stack_fffffffffffff728,(Point2<float> *)0x791785);
        auVar12._8_56_ = extraout_var;
        local_19c = vmovlpd_avx(auVar12._0_16_);
        local_1b0 = LengthSquared<float>((Vector2<float> *)in_stack_fffffffffffff730);
        if ((local_1b0 != 0.0) || (NAN(local_1b0))) {
          args = (char (*) [18])0x0;
          this_02 = (span<const_pbrt::Point3<float>_> *)&stack0xffffffffffffffe0;
          pPVar7 = pstd::span<const_pbrt::Point3<float>_>::operator[](this_02,0);
          fVar37 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).x;
          pstd::span<const_pbrt::Point3<float>_>::operator[](this_02,(size_t)args);
          dpdu_00 = (Vector3f *)local_1c4;
          Vector2<float>::Vector2
                    ((Vector2<float> *)in_stack_fffffffffffff730,
                     (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                     SUB84(in_stack_fffffffffffff728,0));
          auVar13._0_8_ =
               Tuple2<pbrt::Vector2,_float>::operator-
                         ((Tuple2<pbrt::Vector2,_float> *)in_stack_fffffffffffff728);
          auVar13._8_56_ = extraout_var_00;
          local_1c4._8_8_ = vmovlpd_avx(auVar13._0_16_);
          tVar9 = Dot<float>((Vector2<float> *)in_stack_fffffffffffff730,
                             (Vector2<float> *)in_stack_fffffffffffff728);
          local_1b4 = tVar9 / local_1b0;
          val = Lerp(local_1b4,in_XMM1_Da,in_XMM2_Da);
          local_1c8 = Clamp<float,float,float>(val,in_XMM1_Da,in_XMM2_Da);
          local_1cc = Lerp(local_1c8,
                           *(Float *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x34),
                           *(Float *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x38));
          Normal3<float>::Normal3((Normal3<float> *)0x7918cd);
          if (**(int **)&in_RDI->super_Tuple3<pbrt::Point3,_float> == 2) {
            dVar11 = std::sin((double)(ulong)(uint)((1.0 - local_1c8) *
                                                   *(float *)(*(long *)&in_RDI->
                                                  super_Tuple3<pbrt::Point3,_float> + 0x54)));
            local_1dc = SUB84(dVar11,0) *
                        *(float *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x58);
            dVar11 = std::sin((double)(ulong)(uint)(local_1c8 *
                                                   *(float *)(*(long *)&in_RDI->
                                                  super_Tuple3<pbrt::Point3,_float> + 0x54)));
            local_1e0 = SUB84(dVar11,0) *
                        *(float *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x58);
            auVar29 = (undefined1  [56])0x0;
            NVar33 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                     in_stack_fffffffffffff748);
            local_200 = NVar33.super_Tuple3<pbrt::Normal3,_float>.z;
            auVar14._0_8_ = NVar33.super_Tuple3<pbrt::Normal3,_float>._0_8_;
            auVar14._8_56_ = auVar29;
            local_208 = vmovlpd_avx(auVar14._0_16_);
            auVar29 = (undefined1  [56])0x0;
            local_1f8 = local_208;
            local_1f0 = local_200;
            NVar33 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff750 >> 0x20),
                                     in_stack_fffffffffffff748);
            local_244._36_4_ = NVar33.super_Tuple3<pbrt::Normal3,_float>.z;
            auVar15._0_8_ = NVar33.super_Tuple3<pbrt::Normal3,_float>._0_8_;
            auVar15._8_56_ = auVar29;
            local_244._28_8_ = vmovlpd_avx(auVar15._0_16_);
            local_244._44_8_ = local_244._28_8_;
            local_210 = (float)local_244._36_4_;
            NVar33 = Tuple3<pbrt::Normal3,float>::operator+
                               ((Tuple3<pbrt::Normal3,_float> *)in_stack_fffffffffffff740,
                                in_stack_fffffffffffff738);
            local_244._20_4_ = NVar33.super_Tuple3<pbrt::Normal3,_float>.z;
            auVar16._0_8_ = NVar33.super_Tuple3<pbrt::Normal3,_float>._0_8_;
            auVar16._8_56_ = auVar29;
            local_244._12_8_ = vmovlpd_avx(auVar16._0_16_);
            local_1ec._0_8_ = local_244._12_8_;
            local_1ec.z = (float)local_244._20_4_;
            local_1d8._0_8_ = local_244._12_8_;
            local_1d8.z = (float)local_244._20_4_;
            tVar10 = AbsDot<float>((Normal3<float> *)in_stack_fffffffffffff730,
                                   (Vector3<float> *)in_stack_fffffffffffff728);
            local_1cc = (tVar10 / u1_00) * local_1cc;
          }
          this_01 = (Ray *)local_244;
          Vector3<float>::Vector3((Vector3<float> *)0x791a9e);
          Clamp<float,int,int>(local_1b4,0,1);
          auVar29 = extraout_var_01;
          PVar34 = EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
                             (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c4,
                              in_stack_fffffffffffff8b8);
          local_270 = PVar34.super_Tuple3<pbrt::Point3,_float>.z;
          auVar17._0_8_ = PVar34.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar17._8_56_ = auVar29;
          local_278 = vmovlpd_avx(auVar17._0_16_);
          local_250._0_4_ = (float)local_278;
          local_250._4_4_ = (float)((ulong)local_278 >> 0x20);
          auVar30 = vfmadd213ss_fma(ZEXT416((uint)(float)local_250),ZEXT416((uint)(float)local_250),
                                    ZEXT416((uint)(local_250._4_4_ * local_250._4_4_)));
          local_27c = auVar30._0_4_;
          if (local_27c <= local_1cc * local_1cc * 0.25) {
            if ((local_270 < 0.0) || (u1_00 * in_XMM0_Da < local_270)) {
              local_9 = false;
            }
            else {
              if (in_stack_00000008 != (optional<pbrt::ShapeIntersection> *)0x0) {
                local_280 = local_270 / u1_00;
                local_250 = local_278;
                local_248 = local_270;
                bVar5 = pstd::optional<pbrt::ShapeIntersection>::has_value(in_stack_00000008);
                if ((bVar5) &&
                   (in_stack_fffffffffffff76c = local_280,
                   pSVar8 = pstd::optional<pbrt::ShapeIntersection>::value
                                      (in_stack_fffffffffffff730),
                   pSVar8->tHit < in_stack_fffffffffffff76c)) {
                  return false;
                }
                dVar11 = std::sqrt((double)(ulong)(uint)local_27c);
                local_284 = SUB84(dVar11,0);
                auVar30 = vfmadd213ss_fma(ZEXT416((uint)local_250._4_4_ ^ 0x80000000),
                                          ZEXT416((uint)local_244._0_4_),
                                          ZEXT416((uint)((float)local_250 * (float)local_244._4_4_))
                                         );
                local_288 = auVar30._0_4_;
                if (local_288 <= 0.0) {
                  local_898 = 0.5 - local_284 / local_1cc;
                }
                else {
                  local_898 = local_284 / local_1cc + 0.5;
                }
                local_28c = local_898;
                Vector3<float>::Vector3((Vector3<float> *)0x791d02);
                Vector3<float>::Vector3((Vector3<float> *)0x791d0f);
                local_2b8 = pstd::MakeConstSpan<pbrt::Point3<float>,_4UL>
                                      ((Point3<float> (*) [4])0x791d23);
                auVar29 = (undefined1  [56])0x0;
                PVar34 = EvaluateCubicBezier<pbrt::Point3<float>,pbrt::Vector3<float>>
                                   (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c4,
                                    in_stack_fffffffffffff8b8);
                local_2d0 = PVar34.super_Tuple3<pbrt::Point3,_float>.z;
                auVar18._0_8_ = PVar34.super_Tuple3<pbrt::Point3,_float>._0_8_;
                auVar18._8_56_ = auVar29;
                local_2d8 = vmovlpd_avx(auVar18._0_16_);
                auVar29 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
                auVar32 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
                local_2c4 = local_2d8;
                local_2bc = local_2d0;
                Vector3<float>::Vector3
                          ((Vector3<float> *)in_stack_fffffffffffff730,
                           (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                           SUB84(in_stack_fffffffffffff728,0),0.0);
                local_2f0.x = local_298.x;
                local_2f0.y = local_298.y;
                local_2f0.z = local_298.z;
                bVar5 = Tuple3<pbrt::Vector3,_float>::operator!=
                                  (&local_2e4,(Vector3<float> *)&local_2f0);
                if (!bVar5) {
                  LogFatal<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
                            ((LogLevel)fVar38,(char *)wo,(int)((ulong)dpdu_00 >> 0x20),
                             (char *)CONCAT44(fVar37,in_stack_fffffffffffff788),args,
                             (char (*) [5])this_02,(char (*) [18])this_04,
                             (Vector3<float> *)CONCAT44(fVar39,in_stack_fffffffffffff7b8),
                             (char (*) [5])dndu,(Vector3<float> *)dndv);
                }
                if (**(int **)&in_RDI->super_Tuple3<pbrt::Point3,_float> == 2) {
                  VVar35 = Cross<float>((Normal3<float> *)in_stack_fffffffffffff740,
                                        (Vector3<float> *)in_stack_fffffffffffff738);
                  fVar39 = (float)((ulong)in_stack_fffffffffffff738 >> 0x20);
                  local_320 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar19._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar19._8_56_ = auVar29;
                  local_328 = vmovlpd_avx(auVar19._0_16_);
                  local_318 = local_328;
                  local_310 = local_320;
                  VVar35 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff750);
                  local_330 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar20._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar20._8_56_ = auVar29;
                  local_338 = vmovlpd_avx(auVar20._0_16_);
                  auVar29 = (undefined1  [56])0x0;
                  local_308 = local_338;
                  local_300 = local_330;
                  VVar35 = Tuple3<pbrt::Vector3,float>::operator*(in_stack_fffffffffffff740,fVar39);
                  local_340 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar21._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar21._8_56_ = auVar29;
                  local_348 = vmovlpd_avx(auVar21._0_16_);
                  local_2fc = local_348;
                  local_2f4 = local_340;
                  local_2a4 = local_348;
                  local_29c = local_340;
                }
                else {
                  VVar35 = Transform::ApplyInverse<float>
                                     (in_stack_fffffffffffff840,in_stack_fffffffffffff838);
                  local_360 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar22._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar22._8_56_ = auVar29;
                  local_368 = vmovlpd_avx(auVar22._0_16_);
                  auVar3._4_56_ = auVar32;
                  auVar3._0_4_ = 0x80000000;
                  auVar30._0_8_ = auVar3._0_8_ << 0x20;
                  auVar30._8_4_ = 0x80000000;
                  auVar30._12_4_ = 0x80000000;
                  auVar29 = ZEXT856(auVar30._8_8_);
                  local_358 = local_368;
                  local_350 = local_360;
                  Vector3<float>::Vector3
                            ((Vector3<float> *)in_stack_fffffffffffff730,
                             (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                             SUB84(in_stack_fffffffffffff728,0),0.0);
                  VVar35 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff750);
                  local_398 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar23._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar23._8_56_ = auVar29;
                  local_3a0 = vmovlpd_avx(auVar23._0_16_);
                  auVar29 = (undefined1  [56])0x0;
                  local_380 = local_3a0;
                  local_378 = local_398;
                  VVar35 = Tuple3<pbrt::Vector3,float>::operator*
                                     (in_stack_fffffffffffff740,
                                      (float)((ulong)in_stack_fffffffffffff738 >> 0x20));
                  local_3a8 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar24._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar24._8_56_ = auVar29;
                  local_3b0 = vmovlpd_avx(auVar24._0_16_);
                  local_374 = local_3b0;
                  local_36c = local_3a8;
                  if (**(int **)&in_RDI->super_Tuple3<pbrt::Point3,_float> == 1) {
                    auVar29 = (undefined1  [56])0x0;
                    local_3b4 = Lerp(local_28c,-90.0,90.0);
                    auVar4._4_56_ = auVar29;
                    auVar4._0_4_ = 0x80000000;
                    auVar31._0_8_ = auVar4._0_8_ << 0x20;
                    auVar31._8_4_ = 0x80000000;
                    auVar31._12_4_ = 0x80000000;
                    auVar29 = ZEXT856(auVar31._8_8_);
                    in_stack_fffffffffffff750 = local_434;
                    Rotate((Float)((ulong)in_stack_fffffffffffff740 >> 0x20),
                           (Vector3f *)in_stack_fffffffffffff738);
                    VVar35 = Transform::operator()
                                       (in_stack_fffffffffffff840,in_stack_fffffffffffff838);
                    local_448 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar25._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                    auVar25._8_56_ = auVar29;
                    local_450 = vmovlpd_avx(auVar25._0_16_);
                    local_440 = local_450;
                    local_438 = local_448;
                    local_374 = local_450;
                    local_36c = local_448;
                  }
                  VVar35 = Transform::operator()
                                     (in_stack_fffffffffffff840,in_stack_fffffffffffff838);
                  local_468 = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar26._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar26._8_56_ = auVar29;
                  local_470 = vmovlpd_avx(auVar26._0_16_);
                  local_45c = local_470;
                  local_454 = local_468;
                  local_2a4 = local_470;
                  local_29c = local_468;
                }
                p = &local_47c;
                Vector3<float>::Vector3
                          ((Vector3<float> *)in_stack_fffffffffffff730,
                           (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                           SUB84(in_stack_fffffffffffff728,0),0.0);
                local_47d = (*(byte *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x70) ^
                            *(byte *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x71)) &
                            1;
                auVar29 = (undefined1  [56])0x0;
                PVar36 = Ray::operator()(this_01,in_stack_fffffffffffff76c);
                local_4b0 = PVar36.super_Tuple3<pbrt::Point3,_float>.z;
                auVar27._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
                auVar27._8_56_ = auVar29;
                local_4b8 = vmovlpd_avx(auVar27._0_16_);
                local_4a8 = local_4b8;
                local_4a0 = local_4b0;
                Point3fi::Point3fi(in_stack_fffffffffffff750,p,(Vector3f *)in_stack_fffffffffffff740
                                  );
                auVar29 = (undefined1  [56])0x0;
                Point2<float>::Point2
                          ((Point2<float> *)in_stack_fffffffffffff730,
                           (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                           SUB84(in_stack_fffffffffffff728,0));
                VVar35 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff730);
                local_5f0._32_4_ = VVar35.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar28._0_8_ = VVar35.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar28._8_56_ = auVar29;
                local_5f0._24_8_ = vmovlpd_avx(auVar28._0_16_);
                local_5f0._44_8_ = local_5f0._24_8_;
                local_5f0._52_4_ = local_5f0._32_4_;
                memset(local_5f0 + 0xc,0,0xc);
                Normal3<float>::Normal3((Normal3<float> *)0x79227d);
                memset(local_5f0,0,0xc);
                Normal3<float>::Normal3((Normal3<float> *)0x79229e);
                pSVar8 = (ShapeIntersection *)(local_5f0 + 0xc);
                this_00 = (optional<pbrt::ShapeIntersection> *)local_5f0;
                SurfaceInteraction::SurfaceInteraction
                          (this_04,(Point3fi *)this_03,
                           (Point2f *)CONCAT44(fVar38,in_stack_fffffffffffff7a0),wo,dpdu_00,
                           (Vector3f *)CONCAT44(fVar37,in_stack_fffffffffffff788),dndu,dndv,
                           (Float)((ulong)args >> 0x20),SUB81((ulong)args >> 0x18,0));
                Transform::operator()(in_stack_fffffffffffff998,in_stack_fffffffffffff990);
                SurfaceInteraction::operator=((SurfaceInteraction *)this_00,&pSVar8->intr);
                SurfaceInteraction::SurfaceInteraction((SurfaceInteraction *)this_00,&pSVar8->intr);
                pstd::optional<pbrt::ShapeIntersection>::operator=(this_00,pSVar8);
              }
              *(long *)(*in_FS_OFFSET + -0x480) = *(long *)(*in_FS_OFFSET + -0x480) + 1;
              local_9 = true;
            }
          }
          else {
            local_9 = false;
          }
        }
        else {
          local_9 = false;
        }
      }
      else {
        local_9 = false;
      }
    }
    else {
      local_9 = false;
    }
  }
  else {
    SubdivideCubicBezier<pbrt::Point3<float>>(in_stack_fffffffffffff9f8);
    local_c4[0] = in_XMM1_Da;
    local_c4[1] = (in_XMM1_Da + in_XMM2_Da) / 2.0;
    local_c4[2] = in_XMM2_Da;
    for (local_c8 = 0; local_c8 < 2; local_c8 = local_c8 + 1) {
      local_d0 = Lerp(local_c4[local_c8],
                      *(Float *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x34),
                      *(Float *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x38));
      local_d4 = Lerp(local_c4[local_c8 + 1],
                      *(Float *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x34),
                      *(Float *)(*(long *)&in_RDI->super_Tuple3<pbrt::Point3,_float> + 0x38));
      pfVar6 = std::max<float>(&local_d0,&local_d4);
      local_cc = *pfVar6;
      pstd::array<pbrt::Point3<float>,_7>::operator[]
                ((array<pbrt::Point3<float>,_7> *)(local_c4 + 8),(long)(local_c8 * 3));
      local_e8 = pstd::MakeConstSpan<pbrt::Point3<float>_>
                           ((Point3<float> *)in_stack_fffffffffffff730,
                            (size_t)in_stack_fffffffffffff728);
      pstd::span<const_pbrt::Point3<float>_>::operator[](&local_e8,0);
      pstd::span<const_pbrt::Point3<float>_>::operator[](&local_e8,1);
      Bounds3<float>::Bounds3
                (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                 (Point3<float> *)in_stack_fffffffffffff750);
      pstd::span<const_pbrt::Point3<float>_>::operator[](&local_e8,2);
      pstd::span<const_pbrt::Point3<float>_>::operator[](&local_e8,3);
      Bounds3<float>::Bounds3
                (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                 (Point3<float> *)in_stack_fffffffffffff750);
      Union<float>(in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      Expand<float,float>(in_stack_fffffffffffff7b0,
                          (float)((ulong)in_stack_fffffffffffff7a8 >> 0x20));
      local_100.pMin.super_Tuple3<pbrt::Point3,_float>.x = local_148[0].x;
      local_100.pMin.super_Tuple3<pbrt::Point3,_float>.y = local_148[0].y;
      local_100.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_148[0].z;
      local_100.pMax.super_Tuple3<pbrt::Point3,_float>.x = local_148[1].x;
      local_100.pMax.super_Tuple3<pbrt::Point3,_float>.y = local_148[1].y;
      local_100.pMax.super_Tuple3<pbrt::Point3,_float>.z = local_148[1].z;
      Point3<float>::Point3
                ((Point3<float> *)in_stack_fffffffffffff730,
                 (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                 SUB84(in_stack_fffffffffffff728,0),0.0);
      Length<float>((Vector3<float> *)0x791312);
      Point3<float>::Point3
                ((Point3<float> *)in_stack_fffffffffffff730,
                 (float)((ulong)in_stack_fffffffffffff728 >> 0x20),
                 SUB84(in_stack_fffffffffffff728,0),0.0);
      Bounds3<float>::Bounds3
                (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                 (Point3<float> *)in_stack_fffffffffffff750);
      bVar5 = Overlaps<float>(&local_160,&local_100);
      if (bVar5) {
        local_190 = local_e8.ptr;
        local_188 = local_e8.n;
        cp_00.n = (size_t)in_RDX;
        cp_00.ptr = pPVar7;
        in_stack_fffffffffffff728 = in_stack_00000008;
        local_179 = RecursiveIntersect(in_RSI,(Ray *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8),
                                       (Float)((ulong)in_R8 >> 0x20),cp_00,
                                       (Transform *)CONCAT44(in_XMM1_Da,in_XMM2_Da),in_R9D,u1_00,
                                       in_stack_ffffffffffffffac,unaff_retaddr);
        if (((bool)local_179) && (in_stack_00000008 == (optional<pbrt::ShapeIntersection> *)0x0)) {
          return true;
        }
      }
    }
    if (in_stack_00000008 == (optional<pbrt::ShapeIntersection> *)0x0) {
      local_801 = false;
    }
    else {
      local_801 = pstd::optional<pbrt::ShapeIntersection>::has_value(in_stack_00000008);
    }
    local_9 = local_801;
  }
  return local_9;
}

Assistant:

bool Curve::RecursiveIntersect(const Ray &ray, Float tMax, pstd::span<const Point3f> cp,
                               const Transform &ObjectFromRay, Float u0, Float u1,
                               int depth, pstd::optional<ShapeIntersection> *si) const {
    Float rayLength = Length(ray.d);
    if (depth > 0) {
        // Split curve segment into sub-segments and test for intersection
        pstd::array<Point3f, 7> cpSplit = SubdivideCubicBezier(cp);
        Float u[3] = {u0, (u0 + u1) / 2, u1};
        for (int seg = 0; seg < 2; ++seg) {
            // Check ray against curve segment's bounding box
            Float maxWidth =
                std::max(Lerp(u[seg], common->width[0], common->width[1]),
                         Lerp(u[seg + 1], common->width[0], common->width[1]));
            pstd::span<const Point3f> cps = pstd::MakeConstSpan(&cpSplit[3 * seg], 4);
            Bounds3f curveBounds =
                Union(Bounds3f(cps[0], cps[1]), Bounds3f(cps[2], cps[3]));
            curveBounds = Expand(curveBounds, 0.5f * maxWidth);
            Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
            if (!Overlaps(rayBounds, curveBounds))
                continue;

            // Recursively test ray-segment intersection
            bool hit = RecursiveIntersect(ray, tMax, cps, ObjectFromRay, u[seg],
                                          u[seg + 1], depth - 1, si);
            if (hit && si == nullptr)
                return true;
        }
        return si ? si->has_value() : false;

    } else {
        // Intersect ray with curve segment
        // Test ray against segment endpoint boundaries
        // Test sample point against tangent perpendicular at curve start
        Float edge = (cp[1].y - cp[0].y) * -cp[0].y + cp[0].x * (cp[0].x - cp[1].x);
        if (edge < 0)
            return false;

        // Test sample point against tangent perpendicular at curve end
        edge = (cp[2].y - cp[3].y) * -cp[3].y + cp[3].x * (cp[3].x - cp[2].x);
        if (edge < 0)
            return false;

        // Find line $w$ that gives minimum distance to sample point
        Vector2f segmentDir = Point2f(cp[3].x, cp[3].y) - Point2f(cp[0].x, cp[0].y);
        Float denom = LengthSquared(segmentDir);
        if (denom == 0)
            return false;
        Float w = Dot(-Vector2f(cp[0].x, cp[0].y), segmentDir) / denom;

        // Compute $u$ coordinate of curve intersection point and _hitWidth_
        Float u = Clamp(Lerp(w, u0, u1), u0, u1);
        Float hitWidth = Lerp(u, common->width[0], common->width[1]);
        Normal3f nHit;
        if (common->type == CurveType::Ribbon) {
            // Scale _hitWidth_ based on ribbon orientation
            Float sin0 =
                std::sin((1 - u) * common->normalAngle) * common->invSinNormalAngle;
            Float sin1 = std::sin(u * common->normalAngle) * common->invSinNormalAngle;
            nHit = sin0 * common->n[0] + sin1 * common->n[1];
            hitWidth *= AbsDot(nHit, ray.d) / rayLength;
        }

        // Test intersection point against curve width
        Vector3f dpcdw;
        Point3f pc =
            EvaluateCubicBezier(pstd::span<const Point3f>(cp), Clamp(w, 0, 1), &dpcdw);
        Float ptCurveDist2 = pc.x * pc.x + pc.y * pc.y;
        if (ptCurveDist2 > hitWidth * hitWidth * .25f)
            return false;
        if (pc.z < 0 || pc.z > rayLength * tMax)
            return false;

        if (si != nullptr) {
            // Initialize _ShapeIntersection_ for curve intersection
            // Compute _tHit_ for curve intersection
            // FIXME: this tHit isn't quite right for ribbons...
            Float tHit = pc.z / rayLength;
            if (si->has_value() && tHit > si->value().tHit)
                return false;

            // Initialize _SurfaceInteraction_ _intr_ for curve intersection
            // Compute $v$ coordinate of curve intersection point
            Float ptCurveDist = std::sqrt(ptCurveDist2);
            Float edgeFunc = dpcdw.x * -pc.y + pc.x * dpcdw.y;
            Float v = (edgeFunc > 0) ? 0.5f + ptCurveDist / hitWidth
                                     : 0.5f - ptCurveDist / hitWidth;

            // Compute $\dpdu$ and $\dpdv$ for curve intersection
            Vector3f dpdu, dpdv;
            EvaluateCubicBezier(pstd::MakeConstSpan(common->cpObj), u, &dpdu);
            CHECK_NE(Vector3f(0, 0, 0), dpdu);
            if (common->type == CurveType::Ribbon)
                dpdv = Normalize(Cross(nHit, dpdu)) * hitWidth;
            else {
                // Compute curve $\dpdv$ for flat and cylinder curves
                Vector3f dpduPlane = ObjectFromRay.ApplyInverse(dpdu);
                Vector3f dpdvPlane =
                    Normalize(Vector3f(-dpduPlane.y, dpduPlane.x, 0)) * hitWidth;
                if (common->type == CurveType::Cylinder) {
                    // Rotate _dpdvPlane_ to give cylindrical appearance
                    Float theta = Lerp(v, -90., 90.);
                    Transform rot = Rotate(-theta, dpduPlane);
                    dpdvPlane = rot(dpdvPlane);
                }
                dpdv = ObjectFromRay(dpdvPlane);
            }

            // Compute error bounds for curve intersection
            Vector3f pError(2 * hitWidth, 2 * hitWidth, 2 * hitWidth);

            bool flipNormal =
                common->reverseOrientation ^ common->transformSwapsHandedness;
            Point3fi pi(ray(tHit), pError);
            SurfaceInteraction intr(pi, {u, v}, -ray.d, dpdu, dpdv, Normal3f(),
                                    Normal3f(), ray.time, flipNormal);
            intr = (*common->renderFromObject)(intr);

            *si = ShapeIntersection{intr, tHit};
        }
#ifndef PBRT_IS_GPU_CODE
        ++nCurveHits;
#endif
        return true;
    }
}